

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity_State_Update_PDU.cpp
# Opt level: O2

KString * __thiscall
KDIS::PDU::Entity_State_Update_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Entity_State_Update_PDU *this)

{
  pointer pKVar1;
  ostream *poVar2;
  KCHAR8 in_CL;
  KUINT16 Tabs;
  KUINT16 Tabs_00;
  pointer pKVar3;
  KStringStream ss;
  KString KStack_278;
  KString local_258;
  KString local_238;
  KString local_218;
  KString local_1f8;
  KString local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  Header7::GetAsString_abi_cxx11_(&local_258,&this->super_Header);
  poVar2 = std::operator<<(local_1a8,(string *)&local_258);
  poVar2 = std::operator<<(poVar2,"-Entity State Update PDU-\n");
  poVar2 = std::operator<<(poVar2,"Entity ID:\n");
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_1d8,&this->m_EntityID);
  UTILS::IndentString(&KStack_278,&local_1d8,Tabs,in_CL);
  poVar2 = std::operator<<(poVar2,(string *)&KStack_278);
  poVar2 = std::operator<<(poVar2,"Number Of Variable Params:      ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(ushort)this->m_ui8NumOfVariableParams);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Linear Velocity:                ");
  DATA_TYPE::Vector::GetAsString_abi_cxx11_(&local_1f8,&this->m_EntityLinearVelocity);
  poVar2 = std::operator<<(poVar2,(string *)&local_1f8);
  poVar2 = std::operator<<(poVar2,"Entity Location:                ");
  DATA_TYPE::WorldCoordinates::GetAsString_abi_cxx11_(&local_218,&this->m_EntityLocation);
  poVar2 = std::operator<<(poVar2,(string *)&local_218);
  poVar2 = std::operator<<(poVar2,"Entity Orientation:             ");
  DATA_TYPE::EulerAngles::GetAsString_abi_cxx11_(&local_238,&this->m_EntityOrientation);
  std::operator<<(poVar2,(string *)&local_238);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&KStack_278);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_258);
  pKVar1 = (this->m_vVariableParameters).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pKVar3 = (this->m_vVariableParameters).
                super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pKVar3 != pKVar1; pKVar3 = pKVar3 + 1) {
    (*(pKVar3->m_pRef->super_DataTypeBase)._vptr_DataTypeBase[2])(&KStack_278);
    UTILS::IndentString(&local_258,&KStack_278,Tabs_00,in_CL);
    std::operator<<(local_1a8,(string *)&local_258);
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::string::~string((string *)&KStack_278);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

KString Entity_State_Update_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Entity State Update PDU-\n"
       << "Entity ID:\n"
       << IndentString( m_EntityID.GetAsString(), 1 )
       << "Number Of Variable Params:      " << ( KUINT16 )m_ui8NumOfVariableParams << "\n"
       << "Linear Velocity:                " << m_EntityLinearVelocity.GetAsString()
       << "Entity Location:                " << m_EntityLocation.GetAsString()
       << "Entity Orientation:             " << m_EntityOrientation.GetAsString();
    // We can not print the entity appearance as we do not have the entity type.

    // Variable params
    vector<VarPrmPtr>::const_iterator citr = m_vVariableParameters.begin();
    vector<VarPrmPtr>::const_iterator citrEnd = m_vVariableParameters.end();
    for( ; citr != citrEnd; ++ citr )
    {
        ss << IndentString( ( *citr )->GetAsString(), 1 );
    }

    return ss.str();
}